

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

string * __thiscall
soul::AST::ProcessorInstance::getReadableName_abi_cxx11_
          (string *__return_storage_ptr__,ProcessorInstance *this)

{
  bool bVar1;
  Expression *pEVar2;
  ProcessorBase *pPVar3;
  string *psVar4;
  UnqualifiedName *this_00;
  pool_ptr<soul::AST::ProcessorBase> local_28;
  pool_ptr<soul::AST::ProcessorBase> original;
  pool_ptr<soul::AST::ProcessorBase> target;
  ProcessorInstance *this_local;
  
  bVar1 = isImplicitlyCreated(this);
  if ((bVar1) &&
     (bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&this->targetProcessor,(void *)0x0), bVar1
     )) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->targetProcessor);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[6])(&original);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&original);
    if (bVar1) {
      pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&original);
      local_28.object = (pPVar3->originalBeforeSpecialisation).object;
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
      if (bVar1) {
        pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_28);
        psVar4 = Identifier::toString_abi_cxx11_(&(pPVar3->super_ModuleBase).name);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
      }
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_28);
      if (!bVar1) {
        pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&original);
        psVar4 = Identifier::toString_abi_cxx11_(&(pPVar3->super_ModuleBase).name);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&original);
    if (bVar1 != false) {
      return __return_storage_ptr__;
    }
  }
  this_00 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&this->instanceName);
  UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string getReadableName() const
        {
            if (isImplicitlyCreated() && targetProcessor != nullptr)
            {
                if (auto target = targetProcessor->getAsProcessor())
                {
                    if (auto original = target->originalBeforeSpecialisation)
                        return original->name.toString();

                    return target->name.toString();
                }
            }

            return instanceName->toString();
        }